

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::detail::formatImpl(ostream *out,char *fmt,FormatArg *args,int numArgs)

{
  long lVar1;
  char *pcVar2;
  allocator<char> *__a;
  undefined8 uVar3;
  int in_ECX;
  long *in_RDI;
  long in_FS_OFFSET;
  size_t iend;
  size_t i;
  FormatArg *arg;
  char *fmtEnd;
  char origFill;
  fmtflags origFlags;
  streamsize origPrecision;
  streamsize origWidth;
  int ntrunc;
  bool spacePadPositive;
  int argIndex;
  bool positionalMode;
  string result;
  ostringstream tmpStream;
  ios_base *in_stack_fffffffffffffd48;
  int ntrunc_00;
  int in_stack_fffffffffffffd50;
  fmtflags in_stack_fffffffffffffd54;
  ios_base *in_stack_fffffffffffffd58;
  ostream *in_stack_fffffffffffffd60;
  FormatArg *in_stack_fffffffffffffd68;
  allocator<char> *in_stack_fffffffffffffd88;
  char *in_stack_fffffffffffffd90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  char local_1e9;
  int iVar4;
  uint in_stack_fffffffffffffe1c;
  char *in_stack_fffffffffffffe20;
  int *in_stack_fffffffffffffe28;
  bool *in_stack_fffffffffffffe30;
  bool *in_stack_fffffffffffffe38;
  ostream *in_stack_fffffffffffffe40;
  int *in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::ios_base::width(in_stack_fffffffffffffd48);
  std::ios_base::precision(in_stack_fffffffffffffd48);
  std::ios_base::flags(in_stack_fffffffffffffd48);
  std::ios::fill();
  in_stack_fffffffffffffe1c = in_stack_fffffffffffffe1c & 0xffffff;
  iVar4 = 0;
  do {
    pcVar2 = printFormatStringLiteral(in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
    if (*pcVar2 == '\0') {
      if (((in_stack_fffffffffffffe1c & 0x1000000) == 0) && (iVar4 < in_ECX)) {
        __a = (allocator<char> *)__cxa_allocate_exception(0x10);
        pcVar2 = &local_1e9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffffd98,pcVar2,__a);
        format_error::format_error
                  ((format_error *)in_stack_fffffffffffffd58,
                   (string *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(__a,&format_error::typeinfo,format_error::~format_error);
        }
      }
      else {
        std::ios_base::width
                  (in_stack_fffffffffffffd58,
                   CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
        std::ios_base::precision
                  (in_stack_fffffffffffffd58,
                   CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
        std::ios_base::flags(in_stack_fffffffffffffd58,in_stack_fffffffffffffd54);
        std::ios::fill((char)in_RDI + (char)*(undefined8 *)(*in_RDI + -0x18));
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          return;
        }
      }
LAB_00121392:
      __stack_chk_fail();
    }
    ntrunc_00 = (int)((ulong)&stack0xfffffffffffffe18 >> 0x20);
    in_stack_fffffffffffffd50 = in_ECX;
    streamStateFromFormat
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
               in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
               (FormatArg *)CONCAT44(in_stack_fffffffffffffe1c,iVar4),in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff18);
    if (in_ECX <= iVar4) {
      uVar3 = __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      format_error::format_error
                ((format_error *)in_stack_fffffffffffffd58,
                 (string *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(uVar3,&format_error::typeinfo,format_error::~format_error);
      }
      goto LAB_00121392;
    }
    FormatArg::format(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                      (char *)in_stack_fffffffffffffd58,
                      (char *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                      ntrunc_00);
    if ((in_stack_fffffffffffffe1c & 0x1000000) == 0) {
      iVar4 = iVar4 + 1;
    }
  } while( true );
}

Assistant:

inline void formatImpl(std::ostream& out, const char* fmt,
                       const detail::FormatArg* args,
                       int numArgs)
{
    // Saved stream state
    std::streamsize origWidth = out.width();
    std::streamsize origPrecision = out.precision();
    std::ios::fmtflags origFlags = out.flags();
    char origFill = out.fill();

    // "Positional mode" means all format specs should be of the form "%n$..."
    // with `n` an integer. We detect this in `streamStateFromFormat`.
    bool positionalMode = false;
    int argIndex = 0;
    while (true) {
        fmt = printFormatStringLiteral(out, fmt);
        if (*fmt == '\0') {
            if (!positionalMode && argIndex < numArgs) {
                TINYFORMAT_ERROR("tinyformat: Not enough conversion specifiers in format string");
            }
            break;
        }
        bool spacePadPositive = false;
        int ntrunc = -1;
        const char* fmtEnd = streamStateFromFormat(out, positionalMode, spacePadPositive, ntrunc, fmt,
                                                   args, argIndex, numArgs);
        // NB: argIndex may be incremented by reading variable width/precision
        // in `streamStateFromFormat`, so do the bounds check here.
        if (argIndex >= numArgs) {
            TINYFORMAT_ERROR("tinyformat: Too many conversion specifiers in format string");
            return;
        }
        const FormatArg& arg = args[argIndex];
        // Format the arg into the stream.
        if (!spacePadPositive) {
            arg.format(out, fmt, fmtEnd, ntrunc);
        }
        else {
            // The following is a special case with no direct correspondence
            // between stream formatting and the printf() behaviour.  Simulate
            // it crudely by formatting into a temporary string stream and
            // munging the resulting string.
            std::ostringstream tmpStream;
            tmpStream.copyfmt(out);
            tmpStream.setf(std::ios::showpos);
            arg.format(tmpStream, fmt, fmtEnd, ntrunc);
            std::string result = tmpStream.str(); // allocates... yuck.
            for (size_t i = 0, iend = result.size(); i < iend; ++i) {
                if (result[i] == '+')
                    result[i] = ' ';
            }
            out << result;
        }
        if (!positionalMode)
            ++argIndex;
        fmt = fmtEnd;
    }

    // Restore stream state
    out.width(origWidth);
    out.precision(origPrecision);
    out.flags(origFlags);
    out.fill(origFill);
}